

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O0

size_t mi_segment_calculate_slices(size_t required,size_t *info_slices)

{
  size_t alignment;
  uintptr_t uVar1;
  ulong *in_RSI;
  long in_RDI;
  size_t segment_size;
  size_t guardsize;
  size_t isize;
  size_t page_size;
  undefined8 local_38;
  
  alignment = _mi_os_page_size();
  uVar1 = _mi_align_up(0xc180,alignment);
  uVar1 = _mi_align_up(uVar1,0x10000);
  if (in_RSI != (ulong *)0x0) {
    *in_RSI = uVar1 >> 0x10;
  }
  if (in_RDI == 0) {
    local_38 = 0x2000000;
  }
  else {
    local_38 = _mi_align_up(in_RDI + uVar1,0x10000);
  }
  return local_38 >> 0x10;
}

Assistant:

static size_t mi_segment_calculate_slices(size_t required, size_t* info_slices) {
  size_t page_size = _mi_os_page_size();
  size_t isize     = _mi_align_up(sizeof(mi_segment_t), page_size);
  size_t guardsize = 0;

  if (MI_SECURE>0) {
    // in secure mode, we set up a protected page in between the segment info
    // and the page data (and one at the end of the segment)
    guardsize = page_size;
    if (required > 0) {
      required = _mi_align_up(required, MI_SEGMENT_SLICE_SIZE) + page_size;
    }
  }

  isize = _mi_align_up(isize + guardsize, MI_SEGMENT_SLICE_SIZE);
  if (info_slices != NULL) *info_slices = isize / MI_SEGMENT_SLICE_SIZE;
  size_t segment_size = (required==0 ? MI_SEGMENT_SIZE : _mi_align_up( required + isize + guardsize, MI_SEGMENT_SLICE_SIZE) );
  mi_assert_internal(segment_size % MI_SEGMENT_SLICE_SIZE == 0);
  return (segment_size / MI_SEGMENT_SLICE_SIZE);
}